

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O2

Uint32 anon_unknown.dwarf_1f0127::RenderTargetImpl::equationToGlConstant(Equation blendEquation)

{
  Uint32 UVar1;
  ostream *poVar2;
  int *piVar3;
  
  switch(blendEquation) {
  case Add:
    return 0x8006;
  case Subtract:
    piVar3 = &SF_GLAD_GL_EXT_blend_subtract;
    UVar1 = 0x800a;
    break;
  case ReverseSubtract:
    piVar3 = &SF_GLAD_GL_EXT_blend_subtract;
    UVar1 = 0x800b;
    break;
  case Min:
    piVar3 = &SF_GLAD_GL_EXT_blend_minmax;
    UVar1 = 0x8007;
    break;
  case Max:
    piVar3 = &SF_GLAD_GL_EXT_blend_minmax;
    UVar1 = 0x8008;
    break;
  default:
    goto switchD_00162b2a_default;
  }
  if (*piVar3 != 0) {
    return UVar1;
  }
switchD_00162b2a_default:
  if ((anonymous_namespace)::RenderTargetImpl::equationToGlConstant(sf::BlendMode::Equation)::warned
      != '\0') {
    return 0x8006;
  }
  poVar2 = sf::err();
  poVar2 = std::operator<<(poVar2,
                           "OpenGL extension EXT_blend_minmax or EXT_blend_subtract unavailable");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = sf::err();
  poVar2 = std::operator<<(poVar2,"Some blending equations will fallback to sf::BlendMode::Add");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = sf::err();
  poVar2 = std::operator<<(poVar2,"Ensure that hardware acceleration is enabled if available");
  std::endl<char,std::char_traits<char>>(poVar2);
  (anonymous_namespace)::RenderTargetImpl::equationToGlConstant(sf::BlendMode::Equation)::warned = 1
  ;
  return 0x8006;
}

Assistant:

sf::Uint32 equationToGlConstant(sf::BlendMode::Equation blendEquation)
        {
            switch (blendEquation)
            {
                case sf::BlendMode::Add:
                    return GLEXT_GL_FUNC_ADD;
                case sf::BlendMode::Subtract:
                    if (GLEXT_blend_subtract)
                        return GLEXT_GL_FUNC_SUBTRACT;
                    break;
                case sf::BlendMode::ReverseSubtract:
                    if (GLEXT_blend_subtract)
                        return GLEXT_GL_FUNC_REVERSE_SUBTRACT;
                    break;
                case sf::BlendMode::Min:
                    if (GLEXT_blend_minmax)
                        return GLEXT_GL_MIN;
                    break;
                case sf::BlendMode::Max:
                    if (GLEXT_blend_minmax)
                        return GLEXT_GL_MAX;
                    break;
            }

            static bool warned = false;
            if (!warned)
            {
                sf::err() << "OpenGL extension EXT_blend_minmax or EXT_blend_subtract unavailable" << std::endl;
                sf::err() << "Some blending equations will fallback to sf::BlendMode::Add" << std::endl;
                sf::err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

                warned = true;
            }

            return GLEXT_GL_FUNC_ADD;
        }